

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefinitionIntroduction.cpp
# Opt level: O1

Term * __thiscall
Inferences::DefinitionIntroduction::lgg(DefinitionIntroduction *this,Term *left,Term *right)

{
  int iVar1;
  TermList TVar2;
  TermList TVar3;
  ulong uVar4;
  undefined8 uVar5;
  bool bVar6;
  Entry *pEVar7;
  Term *pTVar8;
  uint val;
  uint uVar9;
  pair<Kernel::TermList,_Kernel::TermList> key;
  SubtermIterator right_it;
  SubtermIterator left_it;
  pair<Kernel::TermList,_Kernel::TermList> local_90;
  SubtermIterator local_80;
  SubtermIterator local_58;
  
  Kernel::SubtermIterator::SubtermIterator(&local_58,left);
  Kernel::SubtermIterator::SubtermIterator(&local_80,right);
  val = 0;
  do {
    bVar6 = Kernel::SubtermIterator::hasNext(&local_58);
    if (!bVar6) {
      pTVar8 = Kernel::Term::create
                         (left->_functor,*(uint *)&left->field_0xc & 0xfffffff,
                          (TermList *)Inferences::args._8_8_);
      Inferences::args._16_8_ = Inferences::args._8_8_;
      ::Lib::
      DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::reset((DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
               *)substitution);
      local_80.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
           (_func_int **)&PTR__SubtermIterator_00b69868;
      ::Lib::
      Recycled<Lib::Stack<const_Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_80._stack);
      local_58.super_IteratorCore<Kernel::TermList>._vptr_IteratorCore =
           (_func_int **)&PTR__SubtermIterator_00b69868;
      ::Lib::
      Recycled<Lib::Stack<const_Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_58._stack);
      return pTVar8;
    }
    Kernel::SubtermIterator::hasNext(&local_80);
    local_58._used = true;
    TVar2._content =
         (*(TermList ***)
           ((long)local_58._stack._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>._M_head_impl
           + 0x10))[-1]->_content;
    local_80._used = true;
    TVar3._content =
         (*(TermList ***)
           ((long)local_80._stack._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<const_Kernel::TermList_*>,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_std::default_delete<Lib::Stack<const_Kernel::TermList_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<const_Kernel::TermList_*>_*,_false>._M_head_impl
           + 0x10))[-1]->_content;
    if (((((uint)TVar3._content | (uint)TVar2._content) & 3) == 0) &&
       (iVar1 = *(int *)(TVar2._content + 8), iVar1 == *(int *)(TVar3._content + 8))) {
      uVar9 = *(uint *)(TVar2._content + 0xc);
      if (functions._16_8_ == functions._24_8_) {
        ::Lib::Stack<Inferences::IncompleteFunction>::expand
                  ((Stack<Inferences::IncompleteFunction> *)functions);
      }
      uVar5 = functions._16_8_;
      *(ulong *)functions._16_8_ = CONCAT44(uVar9,iVar1) & 0xfffffffffffffff;
      *(uint *)(uVar5 + 8) = uVar9 & 0xfffffff;
      functions._16_8_ = functions._16_8_ + 0xc;
    }
    else {
      local_90.first._content = TVar2._content;
      local_90.second._content = TVar3._content;
      pEVar7 = ::Lib::
               DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
               ::findEntry((DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
                            *)substitution,&local_90);
      if (pEVar7 == (Entry *)0x0) {
        key.second._content = TVar3._content;
        key.first._content = TVar2._content;
        ::Lib::
        DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
        ::insert((DHMap<std::pair<Kernel::TermList,_Kernel::TermList>,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *)substitution,key,val);
        uVar9 = val + 1;
      }
      else {
        uVar9 = val;
        val = pEVar7->_val;
      }
      if (Inferences::args._16_8_ == Inferences::args._24_8_) {
        ::Lib::Stack<Kernel::TermList>::expand((Stack<Kernel::TermList> *)Inferences::args);
      }
      *(ulong *)Inferences::args._16_8_ = (ulong)(val * 4 + 1);
      Inferences::args._16_8_ = Inferences::args._16_8_ + 8;
      Kernel::SubtermIterator::right(&local_58);
      Kernel::SubtermIterator::right(&local_80);
      val = uVar9;
      if (functions._16_8_ != functions._8_8_) goto LAB_004ccf2b;
    }
    while ((functions._16_8_ != functions._8_8_ && (*(int *)(functions._16_8_ + -4) == 0))) {
      uVar4 = *(ulong *)(functions._16_8_ + -0xc);
      functions._16_8_ = functions._16_8_ + -0xc;
      pTVar8 = Kernel::Term::create
                         ((uint)uVar4,(uint)(uVar4 >> 0x20),
                          (TermList *)(Inferences::args._16_8_ + (uVar4 >> 0x20) * -8));
      Inferences::args._16_8_ =
           Inferences::args._8_8_ +
           (((ulong)(Inferences::args._16_8_ - Inferences::args._8_8_) >> 3) - (uVar4 >> 0x20)) * 8;
      if (Inferences::args._16_8_ == Inferences::args._24_8_) {
        ::Lib::Stack<Kernel::TermList>::expand((Stack<Kernel::TermList> *)Inferences::args);
      }
      *(Term **)Inferences::args._16_8_ = pTVar8;
      Inferences::args._16_8_ = Inferences::args._16_8_ + 8;
      uVar9 = val;
      if (functions._16_8_ == functions._8_8_) break;
LAB_004ccf2b:
      *(int *)(functions._16_8_ + -4) = *(int *)(functions._16_8_ + -4) + -1;
      val = uVar9;
    }
  } while( true );
}

Assistant:

Term *DefinitionIntroduction::lgg(Term *left, Term *right) {
  ASS_EQ(left->functor(), right->functor())
  ASS_EQ(functions.length(), 0)
  ASS_EQ(args.length(), 0)

  unsigned fresh = 0;
  SubtermIterator left_it(left);
  SubtermIterator right_it(right);

  while(left_it.hasNext()) {
    ALWAYS(right_it.hasNext());
    TermList left_top = left_it.next();
    TermList right_top = right_it.next();

    if(left_top.isTerm() && right_top.isTerm() && left_top.term()->functor() == right_top.term()->functor()) {
      unsigned functor = left_top.term()->functor();
      unsigned arity = left_top.term()->arity();
      unsigned remaining = arity;
      functions.push({functor, arity, remaining});
    }
    else {
      unsigned mapped;
      if(!substitution.find({left_top, right_top}, mapped))
        substitution.insert({left_top, right_top}, mapped = fresh++);

      args.push(TermList(mapped, false));
      left_it.right();
      right_it.right();

      if(functions.isNonEmpty())
        functions.top().remaining--;
    }

    while(functions.isNonEmpty() && !functions.top().remaining) {
      IncompleteFunction record = functions.pop();
      Term *term = Term::create(record.functor, record.arity, args.end() - record.arity);
      args.truncate(args.length() - record.arity);
      args.push(TermList(term));

      if(functions.isNonEmpty())
        functions.top().remaining--;
      else
        break;
    }
  }

  ASS(functions.isEmpty());
  ASS_EQ(args.length(), left->arity());
  Term *term = Term::create(left->functor(), left->arity(), args.begin());

  args.reset();
  substitution.reset();
  return term;
}